

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.cpp
# Opt level: O0

void __thiscall Control::apply(Control *this,Network *network,int t,int tod)

{
  double dVar1;
  double dVar2;
  Node *pNVar3;
  Control *pCVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Tank *tank;
  bool makeChange;
  int tod_local;
  int t_local;
  Network *network_local;
  Control *this_local;
  
  switch(*(undefined4 *)&(this->super_Element).field_0x2c) {
  case 0:
    pNVar3 = this->node;
    pCVar4 = this;
    if (((this->levelType == LOW_LEVEL) &&
        (dVar1 = pNVar3[1].actualDemand, dVar2 = this->volume, std::abs((int)this),
        dVar1 <= dVar2 + extraout_XMM0_Qa)) ||
       ((this->levelType == HI_LEVEL &&
        (dVar1 = pNVar3[1].actualDemand, dVar2 = this->volume, std::abs((int)pCVar4),
        dVar2 - extraout_XMM0_Qa_00 <= dVar1)))) {
      activate(this,true,(ostream *)&network->msgLog);
    }
    break;
  case 1:
    break;
  case 2:
    if (t == this->time) {
      activate(this,true,(ostream *)&network->msgLog);
    }
    break;
  case 3:
    if (tod == this->time) {
      activate(this,true,(ostream *)&network->msgLog);
    }
  }
  return;
}

Assistant:

void Control::apply(Network* network, int t, int tod)
{
    bool makeChange = true;
    Tank* tank;

    switch (type)
    {
    case PRESSURE_LEVEL: break;

    case TANK_LEVEL:
        tank = static_cast<Tank*>(node);
        // ... use tolerance of one second's worth of inflow/outflow on action level
        if ( (levelType == LOW_LEVEL && tank->volume <= volume + abs(tank->outflow) )
        ||   (levelType == HI_LEVEL && tank->volume >= volume - abs(tank->outflow)) )
        {
            activate(makeChange, network->msgLog);
        }
        break;

    case ELAPSED_TIME:
        if ( t == time ) activate(makeChange, network->msgLog);
        break;

    case TIME_OF_DAY:
        if ( tod == time ) activate(makeChange, network->msgLog);
        break;
    }
}